

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O0

optional<_khr_df_transfer_e> __thiscall
ktx::OptionsCreate::parseTransferFunction
          (OptionsCreate *this,ParseResult *args,char *argName,char *deprArgName,Reporter *report)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>
  __l;
  bool bVar1;
  int iVar2;
  OptionValue *pOVar3;
  size_t sVar4;
  OptionValue *args_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long lVar6;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>,_true>
  __s;
  string *in_RCX;
  string *in_RDX;
  char **in_RSI;
  const_iterator it;
  string prefixStr;
  string transferStr;
  char *argNameToUse;
  optional<_khr_df_transfer_e> result;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>_>
  *in_stack_fffffffffffff5c8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff5d0;
  string *in_stack_fffffffffffff5d8;
  hasher *in_stack_fffffffffffff5e0;
  size_type in_stack_fffffffffffff5e8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>_>
  *in_stack_fffffffffffff5f0;
  iterator in_stack_fffffffffffff5f8;
  string *option;
  ParseResult *in_stack_fffffffffffff600;
  ParseResult *this_00;
  char *in_stack_fffffffffffff608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff610;
  char **in_stack_fffffffffffff618;
  OptionValue *in_stack_fffffffffffff620;
  Reporter *in_stack_fffffffffffff628;
  char **args_1;
  string *args_00;
  Reporter *this_01;
  undefined1 ***local_928;
  undefined1 local_911 [33];
  _Optional_payload_base<_khr_df_transfer_e> local_8f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>,_true>
  local_8e8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>,_true>
  local_8e0 [3];
  char *local_8c8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined1 local_8a1 [40];
  undefined1 local_879 [33];
  string local_858 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  allocator<char> local_811;
  string local_810 [39];
  allocator<char> local_7e9;
  string local_7e8 [32];
  string *local_7c8;
  undefined1 local_7bf [59];
  undefined4 local_784;
  undefined4 local_780;
  undefined4 local_77c;
  undefined4 local_778;
  undefined4 local_774;
  undefined4 local_770;
  undefined4 local_76c;
  undefined4 local_768;
  undefined4 local_764;
  undefined4 local_760;
  undefined4 local_75c;
  undefined4 local_758;
  undefined4 local_754;
  undefined4 local_750;
  undefined4 local_74c;
  undefined4 local_748;
  undefined4 local_744;
  undefined4 local_740;
  undefined4 local_73c;
  undefined4 local_738;
  undefined4 local_734;
  undefined4 local_730;
  undefined4 local_72c;
  undefined4 local_728;
  undefined4 local_724;
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 local_718;
  undefined4 local_704;
  undefined8 **local_700;
  undefined1 **local_6f8 [5];
  undefined1 local_6d0 [40];
  undefined1 local_6a8 [40];
  undefined1 local_680 [40];
  undefined1 local_658 [40];
  undefined1 local_630 [40];
  undefined1 local_608 [40];
  undefined1 local_5e0 [40];
  undefined1 local_5b8 [40];
  undefined1 local_590 [40];
  undefined1 local_568 [40];
  undefined1 local_540 [40];
  undefined1 local_518 [40];
  undefined1 local_4f0 [40];
  undefined1 local_4c8 [40];
  undefined1 local_4a0 [40];
  undefined1 local_478 [40];
  undefined1 local_450 [40];
  undefined1 local_428 [40];
  undefined1 local_400 [40];
  undefined1 local_3d8 [40];
  undefined1 local_3b0 [40];
  undefined1 local_388 [40];
  undefined1 local_360 [40];
  undefined1 local_338 [40];
  undefined1 local_310 [40];
  undefined1 local_2e8 [40];
  undefined1 local_2c0 [40];
  undefined1 local_298 [40];
  undefined1 local_270 [40];
  undefined1 local_248 [40];
  undefined1 local_220 [40];
  undefined1 local_1f8 [40];
  undefined1 local_1d0 [40];
  undefined1 local_1a8 [40];
  undefined1 local_180 [40];
  undefined1 local_158 [40];
  undefined1 local_130 [40];
  undefined1 local_108 [40];
  undefined1 local_e0 [40];
  undefined1 local_b8 [40];
  undefined1 local_90 [40];
  undefined1 local_68 [40];
  undefined8 **local_40;
  undefined8 local_38;
  string *local_28;
  string *local_20;
  char **local_18;
  _Optional_payload_base<_khr_df_transfer_e> local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if ((parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)::
       values_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)
                                   ::values_abi_cxx11_), iVar2 != 0)) {
    local_700 = local_6f8;
    local_704 = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[5],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [5])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_6d0;
    local_718 = 1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[7],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [7])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_6a8;
    local_71c = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[5],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [5])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_680;
    local_720 = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[10],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [10])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_658;
    local_724 = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [6])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_630;
    local_728 = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [11])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_608;
    local_72c = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[4],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [4])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_5e0;
    local_730 = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [9])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_5b8;
    local_734 = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [6])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_590;
    local_738 = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [11])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_568;
    local_73c = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [6])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_540;
    local_740 = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [11])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_518;
    local_744 = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[7],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [7])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_4f0;
    local_748 = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[12],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [12])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_4c8;
    local_74c = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[10],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [10])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_4a0;
    local_750 = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[15],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [15])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_478;
    local_754 = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[15],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [15])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_450;
    local_758 = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[5],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [5])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_428;
    local_75c = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[10],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [10])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_400;
    local_760 = 5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[5],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [5])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_3d8;
    local_764 = 5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[10],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [10])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_3b0;
    local_768 = 6;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [6])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_388;
    local_76c = 6;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [11])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_360;
    local_770 = 7;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[7],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [7])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_338;
    local_774 = 7;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[12],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [12])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_310;
    local_778 = 8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [9])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_2e8;
    local_77c = 9;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [9])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_2c0;
    local_780 = 0xb;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[8],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [8])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_298;
    local_784 = 10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[8],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [8])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_270;
    local_7bf._55_4_ = 0xc;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [6])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_248;
    local_7bf._51_4_ = 0xc;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [11])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_220;
    local_7bf._47_4_ = 0xd;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [9])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_1f8;
    local_7bf._43_4_ = 0xe;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[12],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [12])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_1d0;
    local_7bf._39_4_ = 0xf;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [6])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_1a8;
    local_7bf._35_4_ = 0xf;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [11])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_180;
    local_7bf._31_4_ = 0xf;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [11])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_158;
    local_7bf._27_4_ = 0x10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[7],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [7])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_130;
    local_7bf._23_4_ = 0x10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[12],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [12])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_108;
    local_7bf._19_4_ = 0x11;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[8],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [8])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_e0;
    local_7bf._15_4_ = 0x11;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[13],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [13])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_b8;
    local_7bf._11_4_ = 0x12;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [9])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_90;
    local_7bf._7_4_ = 0x12;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[14],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [14])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_700 = (undefined8 **)local_68;
    local_7bf._3_4_ = 0x13;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[22],__khr_df_transfer_e,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
                *)in_stack_fffffffffffff600,(char (*) [22])in_stack_fffffffffffff5f8,
               (_khr_df_transfer_e *)in_stack_fffffffffffff5f0);
    local_40 = local_6f8;
    local_38 = 0x2b;
    in_stack_fffffffffffff5c8 =
         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>_>
          *)local_7bf;
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>
    ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>
                 *)0x22c8fd);
    __l._M_len = (size_type)in_stack_fffffffffffff600;
    __l._M_array = in_stack_fffffffffffff5f8;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>_>
    ::unordered_map(in_stack_fffffffffffff5f0,__l,in_stack_fffffffffffff5e8,
                    in_stack_fffffffffffff5e0,(key_equal *)in_stack_fffffffffffff5d8,
                    (allocator_type *)in_stack_fffffffffffff610);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>
    ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>
                  *)0x22c94a);
    local_928 = (undefined1 ***)&local_40;
    do {
      local_928 = local_928 + -5;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
               *)0x22c981);
    } while (local_928 != local_6f8);
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>_>
                 ::~unordered_map,
                 &parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)
                  ::values_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)
                         ::values_abi_cxx11_);
  }
  std::optional<_khr_df_transfer_e>::optional((optional<_khr_df_transfer_e> *)0x22c9d1);
  local_7c8 = (string *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (allocator<char> *)in_stack_fffffffffffff600);
  pOVar3 = cxxopts::ParseResult::operator[]
                     (in_stack_fffffffffffff600,&in_stack_fffffffffffff5f8->first);
  sVar4 = cxxopts::OptionValue::count(pOVar3);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  if (sVar4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
               (allocator<char> *)in_stack_fffffffffffff600);
    pOVar3 = cxxopts::ParseResult::operator[]
                       (in_stack_fffffffffffff600,&in_stack_fffffffffffff5f8->first);
    sVar4 = cxxopts::OptionValue::count(pOVar3);
    std::__cxx11::string::~string(local_810);
    std::allocator<char>::~allocator(&local_811);
    if (sVar4 != 0) {
      Reporter::warning<char_const(&)[85],char_const*&,char_const*&>
                (in_stack_fffffffffffff628,(char (*) [85])in_stack_fffffffffffff620,
                 in_stack_fffffffffffff618,(char **)in_stack_fffffffffffff610);
      local_7c8 = local_28;
    }
  }
  else {
    local_7c8 = local_20;
  }
  if (local_7c8 != (string *)0x0) {
    this_01 = (Reporter *)local_879;
    args_00 = local_7c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
               (allocator<char> *)in_stack_fffffffffffff600);
    args_2 = cxxopts::ParseResult::operator[]
                       (in_stack_fffffffffffff600,&in_stack_fffffffffffff5f8->first);
    pbVar5 = cxxopts::OptionValue::as<std::__cxx11::string>(in_stack_fffffffffffff620);
    std::__cxx11::string::string(local_858,(string *)pbVar5);
    to_upper_copy(in_stack_fffffffffffff5d8);
    std::__cxx11::string::~string(local_858);
    std::__cxx11::string::~string((string *)(local_879 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_879);
    pOVar3 = (OptionValue *)local_8a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
               (allocator<char> *)in_stack_fffffffffffff600);
    std::allocator<char>::~allocator((allocator<char> *)local_8a1);
    lVar6 = std::__cxx11::string::find((string *)&local_838,(ulong)(local_8a1 + 1));
    args_1 = local_18;
    if (lVar6 == 0) {
      in_stack_fffffffffffff610 = &local_838;
      local_8b8 = std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                (in_stack_fffffffffffff5d0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff5c8);
      local_8e0[2]._M_cur = (__node_type *)std::__cxx11::string::begin();
      std::__cxx11::string::size();
      local_8c8 = (char *)__gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)in_stack_fffffffffffff5d8,
                                      (difference_type)in_stack_fffffffffffff5d0);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                (in_stack_fffffffffffff5d0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff5c8);
      local_8e0[1]._M_cur =
           (__node_type *)std::__cxx11::string::erase(in_stack_fffffffffffff610,local_8b0,local_8c0)
      ;
      args_1 = local_18;
    }
    __s._M_cur = (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>_>
                 ::find(in_stack_fffffffffffff5c8,(key_type *)0x22cfb1);
    local_8e0[0]._M_cur = __s._M_cur;
    local_8e8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>_>
         ::end(in_stack_fffffffffffff5c8);
    bVar1 = std::__detail::operator!=(local_8e0,&local_8e8);
    if (bVar1) {
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>,_false,_true>
      ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>,_false,_true>
                    *)0x22d001);
      std::optional<_khr_df_transfer_e>::optional<const__khr_df_transfer_e_&,_true>
                ((optional<_khr_df_transfer_e> *)in_stack_fffffffffffff5d0,
                 (_khr_df_transfer_e *)in_stack_fffffffffffff5c8);
      local_8 = local_8f0;
    }
    else {
      this_00 = (ParseResult *)local_911;
      option = local_7c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff610,(char *)__s._M_cur,(allocator<char> *)this_00);
      cxxopts::ParseResult::operator[](this_00,option);
      cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
      Reporter::fatal_usage<char_const(&)[66],char_const*&,std::__cxx11::string_const&>
                (this_01,(char (*) [66])args_00,args_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2);
      std::__cxx11::string::~string((string *)(local_911 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_911);
    }
    std::__cxx11::string::~string((string *)(local_8a1 + 1));
    std::__cxx11::string::~string((string *)&local_838);
  }
  return (optional<_khr_df_transfer_e>)local_8;
}

Assistant:

std::optional<khr_df_transfer_e> parseTransferFunction(cxxopts::ParseResult& args,
                                                  const char* argName,
                                                  const char* deprArgName,
                                                  Reporter& report) const {
        // Many of these are aliases of others. To prevent breakage, in the
        // unlikely event one is changed to not be an alias, the aliased
        // enumerator names are used.
        static const std::unordered_map<std::string, khr_df_transfer_e> values{
            { "NONE", KHR_DF_TRANSFER_UNSPECIFIED },
            { "LINEAR", KHR_DF_TRANSFER_LINEAR },
            { "SRGB", KHR_DF_TRANSFER_SRGB },
            { "SRGB_EOTF", KHR_DF_TRANSFER_SRGB_EOTF },  // SRGB
            { "SCRGB", KHR_DF_TRANSFER_SCRGB },          // SRGB
            { "SCRGB_EOTF", KHR_DF_TRANSFER_SRGB_EOTF }, // SRGB
            { "ITU", KHR_DF_TRANSFER_ITU },
            { "ITU_OETF", KHR_DF_TRANSFER_ITU_OETF },     // ITU
            { "BT601", KHR_DF_TRANSFER_BT601_OETF },      // ITU
            { "BT601_OETF", KHR_DF_TRANSFER_BT601_OETF }, // ITU
            { "BT709", KHR_DF_TRANSFER_BT709_OETF },      // ITU
            { "BT709_OETF", KHR_DF_TRANSFER_BT709_OETF }, // ITU
            { "BT2020", KHR_DF_TRANSFER_BT2020_OETF },      // ITU
            { "BT2020_OETF", KHR_DF_TRANSFER_BT2020_OETF }, // ITU
            { "SMPTE170M", KHR_DF_TRANSFER_SMTPE170M },           // ITU
            { "SMPTE170M_EOTF", KHR_DF_TRANSFER_SMTPE170M_EOTF }, // ITU
            { "SMPTE170M_OETF", KHR_DF_TRANSFER_SMTPE170M_OETF }, // ITU
            { "NTSC", KHR_DF_TRANSFER_NTSC },
            { "NTSC_EOTF", KHR_DF_TRANSFER_NTSC_EOTF },  // NTSC
            { "SLOG", KHR_DF_TRANSFER_SLOG },
            { "SLOG_OETF", KHR_DF_TRANSFER_SLOG_OETF }, // SLOG
            { "SLOG2", KHR_DF_TRANSFER_SLOG2 },
            { "SLOG2_OETF", KHR_DF_TRANSFER_SLOG2_OETF }, // SLOG2
            { "BT1886", KHR_DF_TRANSFER_BT1886 },
            { "BT1886_EOTF", KHR_DF_TRANSFER_BT1886_EOTF }, // BT1886
            { "HLG_OETF", KHR_DF_TRANSFER_HLG_OETF },
            { "HLG_EOTF", KHR_DF_TRANSFER_HLG_EOTF },
            { "PQ_OETF", KHR_DF_TRANSFER_PQ_OETF },
            { "PQ_EOTF", KHR_DF_TRANSFER_PQ_EOTF },
            { "DCIP3", KHR_DF_TRANSFER_DCIP3 },
            { "DCIP3_EOTF", KHR_DF_TRANSFER_DCIP3_EOTF }, // DCIP3
            { "PAL_OETF", KHR_DF_TRANSFER_PAL_OETF },
            { "PAL625_EOTF", KHR_DF_TRANSFER_PAL625_EOTF },
            { "ST240", KHR_DF_TRANSFER_ST240 },
            { "ST240_EOTF", KHR_DF_TRANSFER_ST240_EOTF }, // ST240
            { "ST240_OETF", KHR_DF_TRANSFER_ST240_OETF }, // ST240
            { "ACESCC", KHR_DF_TRANSFER_ACESCC },
            { "ACESCC_OETF", KHR_DF_TRANSFER_ACESCC_OETF }, // ACESCC
            { "ACESCCT", KHR_DF_TRANSFER_ACESCCT },
            { "ACESCCT_OETF", KHR_DF_TRANSFER_ACESCCT_OETF }, // ACESCCT
            { "ADOBERGB", KHR_DF_TRANSFER_ADOBERGB },
            { "ADOBERGB_EOTF", KHR_DF_TRANSFER_ADOBERGB_EOTF }, // ADOBERGB
            { "HLG_UNNORMALIZED_OETF", KHR_DF_TRANSFER_HLG_UNNORMALIZED_OETF },
        };

        std::optional<khr_df_transfer_e> result = {};
        const char* argNameToUse = nullptr;

        if (args[argName].count()) {
            argNameToUse = argName;
        } else if (args[deprArgName].count()) { // Prefer non-depcrecated name.
            report.warning("Option --{} is deprecated and will be removed in the next release. Use --{} instead.",
                           deprArgName, argName);
            argNameToUse = deprArgName;
        }

        if (argNameToUse) {
            auto transferStr = to_upper_copy(args[argNameToUse].as<std::string>());
            const std::string prefixStr = "KHR_DF_TRANSFER_";
            if (transferStr.find(prefixStr) == 0) {
                transferStr.erase(transferStr.begin(),
                                  transferStr.begin() + prefixStr.size());
            }
            const auto it = values.find(transferStr);
            if (it != values.end()) {
                result = it->second;
            } else {
                report.fatal_usage("Invalid or unsupported transfer specified as --{} argument: \"{}\".",
                                   argNameToUse, args[argNameToUse].as<std::string>());
            }
        }

        return result;
    }